

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_send_vzmpv(telnet_t *telnet,__va_list_tag *va)

{
  uint uVar1;
  char *__s;
  undefined8 *puVar2;
  size_t sVar3;
  int in_ECX;
  undefined8 *puVar4;
  uchar sb [5];
  undefined2 local_1f;
  undefined2 local_1d;
  undefined1 local_1b;
  
  local_1d = 0xfaff;
  local_1b = 0x5d;
  _send((int)telnet,&local_1d,3,in_ECX);
  while( true ) {
    uVar1 = va->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar2 = (undefined8 *)((ulong)uVar1 + (long)va->reg_save_area);
      puVar4 = (undefined8 *)(ulong)(uVar1 + 8);
      va->gp_offset = uVar1 + 8;
    }
    else {
      puVar2 = (undefined8 *)va->overflow_arg_area;
      puVar4 = puVar2 + 1;
      va->overflow_arg_area = puVar4;
    }
    __s = (char *)*puVar2;
    if (__s == (char *)0x0) break;
    sVar3 = strlen(__s);
    telnet_send(telnet,__s,sVar3 + 1);
  }
  local_1f = 0xf0ff;
  _send((int)telnet,&local_1f,2,(int)puVar4);
  return;
}

Assistant:

void telnet_send_vzmpv(telnet_t *telnet, va_list va) {
	const char* arg;

	/* ZMP header */
	telnet_begin_sb(telnet, TELNET_TELOPT_ZMP);

	/* send out each argument, including trailing NUL byte */
	while ((arg = va_arg(va, const char *)) != 0)
		telnet_zmp_arg(telnet, arg);

	/* ZMP footer */
	telnet_finish_zmp(telnet);
}